

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

uint32_t utrie_get32_63(UNewTrie *trie,UChar32 c,UBool *pInBlockZero)

{
  int local_3c;
  int32_t block;
  UBool *pInBlockZero_local;
  UChar32 c_local;
  UNewTrie *trie_local;
  
  if (((trie == (UNewTrie *)0x0) || (trie->isCompacted != '\0')) || (0x10ffff < (uint)c)) {
    if (pInBlockZero != (UBool *)0x0) {
      *pInBlockZero = '\x01';
    }
    trie_local._4_4_ = 0;
  }
  else {
    local_3c = trie->index[c >> 5];
    if (pInBlockZero != (UBool *)0x0) {
      *pInBlockZero = local_3c == 0;
    }
    if (local_3c < 0) {
      local_3c = -local_3c;
    }
    trie_local._4_4_ = trie->data[(int)(local_3c + (c & 0x1fU))];
  }
  return trie_local._4_4_;
}

Assistant:

U_CAPI uint32_t U_EXPORT2
utrie_get32(UNewTrie *trie, UChar32 c, UBool *pInBlockZero) {
    int32_t block;

    /* valid, uncompacted trie and valid c? */
    if(trie==NULL || trie->isCompacted || (uint32_t)c>0x10ffff) {
        if(pInBlockZero!=NULL) {
            *pInBlockZero=TRUE;
        }
        return 0;
    }

    block=trie->index[c>>UTRIE_SHIFT];
    if(pInBlockZero!=NULL) {
        *pInBlockZero= (UBool)(block==0);
    }

    return trie->data[ABS(block)+(c&UTRIE_MASK)];
}